

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ctype.h
# Opt level: O2

CTInfo lj_ctype_info(CTState *cts,CTypeID id,CTSize *szp)

{
  uint uVar1;
  CType *pCVar2;
  uint uVar3;
  CTSize CVar4;
  uint uVar5;
  
  pCVar2 = cts->tab;
  uVar3 = 0;
  do {
    uVar1 = pCVar2[id].info;
    uVar5 = uVar1 >> 0x1c;
    if (uVar5 != 5) {
      if (uVar5 != 8) {
        if (uVar5 == 6) {
          CVar4 = 0xffffffff;
        }
        else {
          CVar4 = pCVar2[id].size;
        }
        uVar5 = 0;
        if ((uVar3 & 1) == 0) {
          uVar5 = uVar1 & 0xf0000;
        }
        *szp = CVar4;
        return uVar5 | uVar1 & 0xfff00000 | uVar3;
      }
      if ((uVar1 & 0x80ff0000) == 0x80020000) {
        if ((uVar3 & 1) == 0) {
          uVar3 = pCVar2[id].size << 0x10 | uVar3 | 1;
        }
      }
      else if ((uVar1 & 0x80ff0000) == 0x80010000) {
        uVar3 = uVar3 | pCVar2[id].size;
      }
    }
    id = uVar1 & 0xffff;
  } while( true );
}

Assistant:

static LJ_AINLINE CType *ctype_get(CTState *cts, CTypeID id)
{
  return &cts->tab[ctype_check(cts, id)];
}